

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Reader * __thiscall
capnp::Orphan<capnp::DynamicValue>::getReader
          (Reader *__return_storage_ptr__,Orphan<capnp::DynamicValue> *this)

{
  bool bVar1;
  uint16_t uVar2;
  SegmentReader *pSVar3;
  RawBrandedSchema *pRVar4;
  size_t sVar5;
  ElementSize elementSize;
  Which elementType;
  uint uVar6;
  int64_t iVar7;
  uint uVar8;
  ArrayPtr<const_unsigned_char> AVar9;
  Fault f;
  Reader local_b8;
  Schema local_88;
  StructReader local_80;
  ListReader local_50;
  
  switch(this->type) {
  case UNKNOWN:
    __return_storage_ptr__->type = UNKNOWN;
    break;
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar1 = (this->field_1).boolValue;
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = bVar1;
    break;
  case INT:
    iVar7 = (this->field_1).intValue;
    __return_storage_ptr__->type = INT;
    goto LAB_001c6d61;
  case UINT:
    iVar7 = (this->field_1).intValue;
    __return_storage_ptr__->type = UINT;
LAB_001c6d61:
    (__return_storage_ptr__->field_1).intValue = iVar7;
    break;
  case FLOAT:
    iVar7 = (this->field_1).intValue;
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = iVar7;
    break;
  case TEXT:
    AVar9 = (ArrayPtr<const_unsigned_char>)capnp::_::OrphanBuilder::asTextReader(&this->builder);
    __return_storage_ptr__->type = TEXT;
    goto LAB_001c6db1;
  case DATA:
    AVar9 = (ArrayPtr<const_unsigned_char>)capnp::_::OrphanBuilder::asDataReader(&this->builder);
    __return_storage_ptr__->type = DATA;
LAB_001c6db1:
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<const_unsigned_char> = AVar9;
    break;
  case LIST:
    iVar7 = (this->field_1).intValue;
    sVar5 = *(size_t *)((long)&this->field_1 + 8);
    elementType = LIST;
    if ((this->field_1).field9[2] == '\0') {
      elementType = (this->field_1).listSchema.elementType.baseType;
    }
    elementSize = anon_unknown_71::elementSizeFor(elementType);
    capnp::_::OrphanBuilder::asListReader(&local_50,&this->builder,elementSize);
    *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_50.structDataSize
    ;
    *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) =
         local_50.structPointerCount;
    *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_50.elementSize;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_50._39_1_;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x38) = local_50.nestingLimit;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x3c) = local_50._44_4_;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = local_50.ptr;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_50.elementCount;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = local_50.step;
    (__return_storage_ptr__->field_1).listValue.reader.segment = local_50.segment;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = local_50.capTable;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).intValue = iVar7;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ = sVar5;
    break;
  case ENUM:
    iVar7 = (this->field_1).intValue;
    uVar2 = (this->field_1).enumValue.value;
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).intValue = iVar7;
    *(uint16_t *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar2;
    break;
  case STRUCT:
    pRVar4 = (RawBrandedSchema *)(this->field_1).intValue;
    local_88.raw = pRVar4;
    Schema::getProto(&local_b8,&local_88);
    uVar8 = 0;
    uVar6 = 0;
    if (0x7f < local_b8._reader.dataSize) {
      uVar6 = (uint)*(ushort *)
                     ((long)&(((CapTableBuilder *)((long)local_b8._reader.data + 8))->
                             super_CapTableReader)._vptr_CapTableReader + 6);
    }
    if (0xcf < local_b8._reader.dataSize) {
      uVar8 = (uint)*(ushort *)
                     &(((CapTableBuilder *)((long)local_b8._reader.data + 0x18))->
                      super_CapTableReader)._vptr_CapTableReader << 0x10;
    }
    capnp::_::OrphanBuilder::asStructReader(&local_80,&this->builder,(StructSize)(uVar8 | uVar6));
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.reader.elementCount =
         local_80._32_8_;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_80.nestingLimit;
    *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 0x34) = local_80._44_2_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_80._46_1_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_80._47_1_;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = (CapTableReader *)local_80.data;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = (byte *)local_80.pointers;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ =
         (size_t)local_80.segment;
    (__return_storage_ptr__->field_1).listValue.reader.segment = (SegmentReader *)local_80.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).intValue = (int64_t)pRVar4;
    break;
  case CAPABILITY:
    pSVar3 = (SegmentReader *)(this->field_1).intValue;
    capnp::_::OrphanBuilder::asCapability((OrphanBuilder *)&local_b8);
    __return_storage_ptr__->type = CAPABILITY;
    *(undefined4 *)&__return_storage_ptr__->field_1 = local_b8._reader.segment._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 4) = local_b8._reader.segment._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_b8._reader.capTable._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0xc) = local_b8._reader.capTable._4_4_;
    (__return_storage_ptr__->field_1).listValue.reader.segment = pSVar3;
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[100]>
              ((Fault *)&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x85a,FAILED,(char *)0x0,
               "\"Can\'t get() an AnyPointer orphan; there is no underlying pointer to \" \"wrap in an AnyPointer::Builder.\""
               ,(char (*) [100])
                "Can\'t get() an AnyPointer orphan; there is no underlying pointer to wrap in an AnyPointer::Builder."
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_b8);
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Reader Orphan<DynamicValue>::getReader() const {
  switch (type) {
    case DynamicValue::UNKNOWN: return nullptr;
    case DynamicValue::VOID: return voidValue;
    case DynamicValue::BOOL: return boolValue;
    case DynamicValue::INT: return intValue;
    case DynamicValue::UINT: return uintValue;
    case DynamicValue::FLOAT: return floatValue;
    case DynamicValue::ENUM: return enumValue;

    case DynamicValue::TEXT: return builder.asTextReader();
    case DynamicValue::DATA: return builder.asDataReader();
    case DynamicValue::LIST:
      return DynamicList::Reader(listSchema,
          builder.asListReader(elementSizeFor(listSchema.whichElementType())));
    case DynamicValue::STRUCT:
      return DynamicStruct::Reader(structSchema,
          builder.asStructReader(structSizeFromSchema(structSchema)));
    case DynamicValue::CAPABILITY:
      return DynamicCapability::Client(interfaceSchema, builder.asCapability());
    case DynamicValue::ANY_POINTER:
      KJ_FAIL_ASSERT("Can't get() an AnyPointer orphan; there is no underlying pointer to "
                     "wrap in an AnyPointer::Builder.");
  }
  KJ_UNREACHABLE;
}